

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_reverse(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  char *p;
  char *s;
  luaL_Buffer b;
  size_t i;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar1 = luaL_checklstring(L,1,&i);
  pcVar2 = luaL_buffinitsize((lua_State *)l,(luaL_Buffer *)&s,i);
  for (b.init._1016_8_ = 0; (ulong)b.init._1016_8_ < i; b.init._1016_8_ = b.init._1016_8_ + 1) {
    pcVar2[b.init._1016_8_] = pcVar1[(i - b.init._1016_8_) + -1];
  }
  luaL_pushresultsize((luaL_Buffer *)&s,i);
  return 1;
}

Assistant:

static int str_reverse (lua_State *L) {
  size_t l, i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i = 0; i < l; i++)
    p[i] = s[l - i - 1];
  luaL_pushresultsize(&b, l);
  return 1;
}